

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_console.hpp
# Opt level: O0

bool iutest::detail::iuConsole::HasColorConsole(void)

{
  bool bVar1;
  char *pcVar2;
  bool local_1b;
  bool local_1a;
  bool term_conf;
  char *env;
  
  pcVar2 = internal::posix::GetEnv("TERM");
  local_1a = false;
  if (pcVar2 != (char *)0x0) {
    bVar1 = IsStringEqual(pcVar2,"xterm");
    local_1b = true;
    if (!bVar1) {
      bVar1 = IsStringEqual(pcVar2,"xterm-color");
      local_1b = true;
      if (!bVar1) {
        bVar1 = IsStringEqual(pcVar2,"xterm-256color");
        local_1b = true;
        if (!bVar1) {
          bVar1 = IsStringEqual(pcVar2,"screen");
          local_1b = true;
          if (!bVar1) {
            bVar1 = IsStringEqual(pcVar2,"screen-256color");
            local_1b = true;
            if (!bVar1) {
              bVar1 = IsStringEqual(pcVar2,"tmux");
              local_1b = true;
              if (!bVar1) {
                bVar1 = IsStringEqual(pcVar2,"tmux-256color");
                local_1b = true;
                if (!bVar1) {
                  bVar1 = IsStringEqual(pcVar2,"rxvt-unicode");
                  local_1b = true;
                  if (!bVar1) {
                    bVar1 = IsStringEqual(pcVar2,"rxvt-unicode-256color");
                    local_1b = true;
                    if (!bVar1) {
                      bVar1 = IsStringEqual(pcVar2,"linux");
                      local_1b = true;
                      if (!bVar1) {
                        local_1b = IsStringEqual(pcVar2,"cygwin");
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    local_1a = local_1b;
  }
  if (local_1a == false) {
    pcVar2 = internal::posix::GetEnv("GITHUB_ACTIONS");
    if (pcVar2 == (char *)0x0) {
      env._7_1_ = false;
    }
    else {
      env._7_1_ = true;
    }
  }
  else {
    env._7_1_ = true;
  }
  return env._7_1_;
}

Assistant:

inline bool iuConsole::HasColorConsole()
{
#if   !IUTEST_HAS_COLORCONSOLE
    return false;
#elif IUTEST_FORCE_COLORCONSOLE
    return true;
#else
#if defined(IUTEST_OS_WINDOWS)
    {
        CONSOLE_SCREEN_BUFFER_INFO csbi;
        if( ::GetConsoleScreenBufferInfo(GetStdHandle(STD_OUTPUT_HANDLE), &csbi) )
        {
            return true;
        }
    }
#endif
    const char* env = internal::posix::GetEnv("TERM");
    const bool term_conf = (env != NULL) && (
        IsStringEqual(env, "xterm")
        || IsStringEqual(env, "xterm-color")
        || IsStringEqual(env, "xterm-256color")
        || IsStringEqual(env, "screen")
        || IsStringEqual(env, "screen-256color")
        || IsStringEqual(env, "tmux")
        || IsStringEqual(env, "tmux-256color")
        || IsStringEqual(env, "rxvt-unicode")
        || IsStringEqual(env, "rxvt-unicode-256color")
        || IsStringEqual(env, "linux")
        || IsStringEqual(env, "cygwin")
        );
    if( term_conf )
    {
        return true;
    }
    // for CI
    if( internal::posix::GetEnv("GITHUB_ACTIONS") != NULL )
    {
        return true;
    }
    return false;
#endif
}